

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colStrBuf.c
# Opt level: O0

void CommitBuffer(Col_Word strbuf)

{
  Col_Word CVar1;
  Col_StringFormat format;
  size_t length;
  Col_Word rope;
  Col_Word strbuf_local;
  
  if (*(long *)(strbuf + 0x10) != 0) {
    CVar1 = Col_NewRope((int)*(char *)(strbuf + 1),(void *)(strbuf + 0x18),
                        *(long *)(strbuf + 0x10) *
                        (ulong)((int)*(char *)(strbuf + 1) & (COL_UCS4|COL_UCS2|COL_UCS1)));
    CVar1 = Col_ConcatRopes(*(Col_Word *)(strbuf + 8),CVar1);
    *(Col_Word *)(strbuf + 8) = CVar1;
    *(undefined8 *)(strbuf + 0x10) = 0;
  }
  return;
}

Assistant:

static void
CommitBuffer(
    Col_Word strbuf)    /*!< String buffer to commit. */
{
    Col_Word rope;
    size_t length;
    Col_StringFormat format;

    /*
     * Check preconditions.
     */

    ASSERT(Col_WordType(strbuf) & COL_STRBUF);
    ASSERT(WORD_TYPE(strbuf) != WORD_TYPE_WRAP);

    if ((length = WORD_STRBUF_LENGTH(strbuf)) == 0) {
        /*
         * Nothing to commit.
         */

        return;
    }

    /*
     * Create rope from buffer and append to accumulated rope.
     */

    format = (Col_StringFormat) WORD_STRBUF_FORMAT(strbuf);
    rope = Col_NewRope(format, WORD_STRBUF_BUFFER(strbuf),
            length * CHAR_WIDTH(format));
    WORD_STRBUF_ROPE(strbuf) = Col_ConcatRopes(WORD_STRBUF_ROPE(strbuf), rope);
    WORD_STRBUF_LENGTH(strbuf) = 0;
}